

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

int stbi__info_main(stbi__context *s,int *x,int *y,int *comp)

{
  bool bVar1;
  int *piVar2;
  int iVar3;
  stbi__gif *g;
  long lVar4;
  char *pcVar5;
  long in_FS_OFFSET;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  stbi__png p;
  char *local_448;
  int *local_440;
  stbi__png local_438 [25];
  
  local_438[0].s = s;
  iVar3 = stbi__png_info_raw(local_438,x,y,comp);
  if (iVar3 != 0) {
    return 1;
  }
  g = (stbi__gif *)malloc(0x8870);
  iVar3 = stbi__gif_header(s,g,comp,1);
  if (iVar3 == 0) {
    free(g);
    s->img_buffer = s->img_buffer_original;
    s->img_buffer_end = s->img_buffer_original_end;
    iVar3 = stbi__hdr_test(s);
    if (iVar3 != 0) {
      stbi__hdr_gettoken(s,(char *)local_438);
      if ((char)local_438[0].s != '\0') {
        bVar1 = false;
        local_440 = comp;
        do {
          auVar6[0] = -(local_438[0].s._7_1_ == '3');
          auVar6[1] = -((char)local_438[0].idata == '2');
          auVar6[2] = -(local_438[0].idata._1_1_ == '-');
          auVar6[3] = -(local_438[0].idata._2_1_ == 'b');
          auVar6[4] = -(local_438[0].idata._3_1_ == 'i');
          auVar6[5] = -(local_438[0].idata._4_1_ == 't');
          auVar6[6] = -(local_438[0].idata._5_1_ == '_');
          auVar6[7] = -(local_438[0].idata._6_1_ == 'r');
          auVar6[8] = -(local_438[0].idata._7_1_ == 'l');
          auVar6[9] = -((char)local_438[0].expanded == 'e');
          auVar6[10] = -(local_438[0].expanded._1_1_ == '_');
          auVar6[0xb] = -(local_438[0].expanded._2_1_ == 'r');
          auVar6[0xc] = -(local_438[0].expanded._3_1_ == 'g');
          auVar6[0xd] = -(local_438[0].expanded._4_1_ == 'b');
          auVar6[0xe] = -(local_438[0].expanded._5_1_ == 'e');
          auVar6[0xf] = -(local_438[0].expanded._6_1_ == '\0');
          auVar7[0] = -((char)local_438[0].s == 'F');
          auVar7[1] = -(local_438[0].s._1_1_ == 'O');
          auVar7[2] = -(local_438[0].s._2_1_ == 'R');
          auVar7[3] = -(local_438[0].s._3_1_ == 'M');
          auVar7[4] = -(local_438[0].s._4_1_ == 'A');
          auVar7[5] = -(local_438[0].s._5_1_ == 'T');
          auVar7[6] = -(local_438[0].s._6_1_ == '=');
          auVar7[7] = -(local_438[0].s._7_1_ == '3');
          auVar7[8] = -((char)local_438[0].idata == '2');
          auVar7[9] = -(local_438[0].idata._1_1_ == '-');
          auVar7[10] = -(local_438[0].idata._2_1_ == 'b');
          auVar7[0xb] = -(local_438[0].idata._3_1_ == 'i');
          auVar7[0xc] = -(local_438[0].idata._4_1_ == 't');
          auVar7[0xd] = -(local_438[0].idata._5_1_ == '_');
          auVar7[0xe] = -(local_438[0].idata._6_1_ == 'r');
          auVar7[0xf] = -(local_438[0].idata._7_1_ == 'l');
          auVar7 = auVar7 & auVar6;
          if ((ushort)((ushort)(SUB161(auVar7 >> 7,0) & 1) |
                       (ushort)(SUB161(auVar7 >> 0xf,0) & 1) << 1 |
                       (ushort)(SUB161(auVar7 >> 0x17,0) & 1) << 2 |
                       (ushort)(SUB161(auVar7 >> 0x1f,0) & 1) << 3 |
                       (ushort)(SUB161(auVar7 >> 0x27,0) & 1) << 4 |
                       (ushort)(SUB161(auVar7 >> 0x2f,0) & 1) << 5 |
                       (ushort)(SUB161(auVar7 >> 0x37,0) & 1) << 6 |
                       (ushort)(SUB161(auVar7 >> 0x3f,0) & 1) << 7 |
                       (ushort)(SUB161(auVar7 >> 0x47,0) & 1) << 8 |
                       (ushort)(SUB161(auVar7 >> 0x4f,0) & 1) << 9 |
                       (ushort)(SUB161(auVar7 >> 0x57,0) & 1) << 10 |
                       (ushort)(SUB161(auVar7 >> 0x5f,0) & 1) << 0xb |
                       (ushort)(SUB161(auVar7 >> 0x67,0) & 1) << 0xc |
                       (ushort)(SUB161(auVar7 >> 0x6f,0) & 1) << 0xd |
                       (ushort)(SUB161(auVar7 >> 0x77,0) & 1) << 0xe |
                      (ushort)(byte)(auVar7[0xf] >> 7) << 0xf) == 0xffff) {
            bVar1 = true;
          }
          stbi__hdr_gettoken(s,(char *)local_438);
          piVar2 = local_440;
        } while ((char)local_438[0].s != '\0');
        if (bVar1) {
          stbi__hdr_gettoken(s,(char *)local_438);
          if (local_438[0].s._2_1_ == ' ' && (short)local_438[0].s == 0x592d) {
            local_448 = (char *)((long)&local_438[0].s + 3);
            lVar4 = strtol(local_448,&local_448,10);
            if (y != (int *)0x0) {
              *y = (int)lVar4;
            }
            local_448 = local_448 + 2;
            do {
              pcVar5 = local_448;
              local_448 = pcVar5 + 1;
            } while (pcVar5[-2] == ' ');
            if (((pcVar5[-2] == '+') && (pcVar5[-1] == 'X')) && (*pcVar5 == ' ')) {
              lVar4 = strtol(local_448,(char **)0x0,10);
              if (x != (int *)0x0) {
                *x = (int)lVar4;
              }
              if (piVar2 != (int *)0x0) {
                *piVar2 = 3;
              }
              goto LAB_00134b78;
            }
          }
        }
      }
    }
    s->img_buffer = s->img_buffer_original;
    s->img_buffer_end = s->img_buffer_original_end;
    *(char **)(in_FS_OFFSET + -0x10) = "unknown image type";
    iVar3 = 0;
  }
  else {
    if (x != (int *)0x0) {
      *x = g->w;
    }
    if (y != (int *)0x0) {
      *y = g->h;
    }
    free(g);
LAB_00134b78:
    iVar3 = 1;
  }
  return iVar3;
}

Assistant:

static int stbi__info_main(stbi__context *s, int *x, int *y, int *comp)
{
   #ifndef STBI_NO_JPEG
   if (stbi__jpeg_info(s, x, y, comp)) return 1;
   #endif

   #ifndef STBI_NO_PNG
   if (stbi__png_info(s, x, y, comp))  return 1;
   #endif

   #ifndef STBI_NO_GIF
   if (stbi__gif_info(s, x, y, comp))  return 1;
   #endif

   #ifndef STBI_NO_BMP
   if (stbi__bmp_info(s, x, y, comp))  return 1;
   #endif

   #ifndef STBI_NO_PSD
   if (stbi__psd_info(s, x, y, comp))  return 1;
   #endif

   #ifndef STBI_NO_PIC
   if (stbi__pic_info(s, x, y, comp))  return 1;
   #endif

   #ifndef STBI_NO_PNM
   if (stbi__pnm_info(s, x, y, comp))  return 1;
   #endif

   #ifndef STBI_NO_HDR
   if (stbi__hdr_info(s, x, y, comp))  return 1;
   #endif

   // test tga last because it's a crappy test!
   #ifndef STBI_NO_TGA
   if (stbi__tga_info(s, x, y, comp))
       return 1;
   #endif
   return stbi__err("unknown image type", "Image not of any known type, or corrupt");
}